

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_for_node.hpp
# Opt level: O2

void __thiscall
ranger::bhvr_tree::
decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node;
  size_t count;
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  node = (this->
         super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
         ).m_first_child._M_t.
         super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
         .
         super__Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
         ._M_head_impl;
  if ((node != (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                *)0x0) && (count = this->m_count, count != 0)) {
    local_28._M_unused._M_object = (void *)0x0;
    local_28._8_8_ = 0;
    local_18 = (_Manager_type)0x0;
    local_10 = hdl->_M_invoker;
    p_Var1 = (hdl->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(hdl->super__Function_base)._M_functor;
      local_28._8_8_ = *(undefined8 *)((long)&(hdl->super__Function_base)._M_functor + 8);
      (hdl->super__Function_base)._M_manager = (_Manager_type)0x0;
      hdl->_M_invoker = (_Invoker_type)0x0;
      local_18 = p_Var1;
    }
    exec_impl(this,ap,node,count,false,(handler_type *)&local_28);
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
    return;
  }
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  ::operator()(ap,hdl,false);
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    auto node = this->get_first_child();
    if (node && m_count > 0) {
      exec_impl(ap, node, m_count, false, std::move(hdl));
    } else {
      ap(hdl, false);
    }
  }